

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

void __thiscall
DebugUtilsData::WrapCallbackData
          (DebugUtilsData *this,AugmentedCallbackData *aug_data,
          XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  XrDebugUtilsObjectNameInfoEXT *pXVar1;
  pointer pXVar2;
  pointer pXVar3;
  undefined4 uVar4;
  uint uVar5;
  XrSdkLogObjectInfo *pXVar6;
  bool bVar7;
  uint32_t obj;
  ulong uVar8;
  XrDebugUtilsMessengerCallbackDataEXT *pXVar9;
  pointer pXVar10;
  XrDebugUtilsMessengerCallbackDataEXT *pXVar11;
  long lVar12;
  XrDebugUtilsObjectNameInfoEXT *obj_1;
  pointer info;
  byte bVar13;
  
  bVar13 = 0;
  aug_data->exported_data = callback_data;
  if (((this->object_info_).object_info_.
       super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->object_info_).object_info_.
       super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
       super__Vector_impl_data._M_finish) && (uVar5 = callback_data->objectCount, uVar5 != 0)) {
    lVar12 = 0x18;
    bVar7 = false;
    for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
      pXVar1 = callback_data->objects;
      pXVar6 = ObjectInfoCollection::LookUpStoredObjectInfo
                         (&this->object_info_,*(uint64_t *)((long)&pXVar1->type + lVar12),
                          *(XrObjectType *)((long)pXVar1 + lVar12 + -8));
      if (*(int *)((long)pXVar1 + lVar12 + -8) == 2) {
        LookUpSessionLabels(this,*(XrSession *)((long)&pXVar1->type + lVar12),&aug_data->labels);
      }
      bVar7 = (bool)(bVar7 | pXVar6 != (XrSdkLogObjectInfo *)0x0);
      uVar5 = callback_data->objectCount;
      lVar12 = lVar12 + 0x28;
    }
    if ((bVar7) ||
       ((aug_data->labels).
        super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (aug_data->labels).
        super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      pXVar9 = callback_data;
      pXVar11 = &aug_data->modified_data;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        uVar4 = *(undefined4 *)&pXVar9->field_0x4;
        pXVar11->type = pXVar9->type;
        *(undefined4 *)&pXVar11->field_0x4 = uVar4;
        pXVar9 = (XrDebugUtilsMessengerCallbackDataEXT *)((long)pXVar9 + (ulong)bVar13 * -0x10 + 8);
        pXVar11 = (XrDebugUtilsMessengerCallbackDataEXT *)
                  ((long)pXVar11 + (ulong)bVar13 * -0x10 + 8);
      }
      std::vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>>::
      _M_assign_aux<XrDebugUtilsObjectNameInfoEXT*>
                ((vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>>
                  *)&aug_data->new_objects,callback_data->objects,
                 callback_data->objects + callback_data->objectCount);
      pXVar2 = (aug_data->new_objects).
               super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (info = (aug_data->new_objects).
                  super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                  ._M_impl.super__Vector_impl_data._M_start; info != pXVar2; info = info + 1) {
        ObjectInfoCollection::LookUpObjectName(&this->object_info_,info);
      }
      (aug_data->modified_data).objects =
           (aug_data->new_objects).
           super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pXVar3 = (aug_data->labels).
               super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)(aug_data->labels).
                     super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pXVar3;
      pXVar10 = (pointer)0x0;
      if (lVar12 != 0) {
        pXVar10 = pXVar3;
      }
      (aug_data->modified_data).sessionLabelCount = (uint32_t)(lVar12 / 0x18);
      (aug_data->modified_data).sessionLabels = pXVar10;
      aug_data->exported_data = &aug_data->modified_data;
    }
  }
  return;
}

Assistant:

void DebugUtilsData::WrapCallbackData(AugmentedCallbackData* aug_data,
                                      const XrDebugUtilsMessengerCallbackDataEXT* callback_data) const {
    // If there's nothing to add, just return the original data as the augmented copy
    aug_data->exported_data = callback_data;
    if (object_info_.Empty() || callback_data->objectCount == 0) {
        return;
    }

    // Inspect each of the callback objects
    bool name_found = false;
    for (uint32_t obj = 0; obj < callback_data->objectCount; ++obj) {
        auto& current_obj = callback_data->objects[obj];
        name_found |= (nullptr != object_info_.LookUpStoredObjectInfo(current_obj.objectHandle, current_obj.objectType));

        // If this is a session, record any labels associated with it
        if (XR_OBJECT_TYPE_SESSION == current_obj.objectType) {
            XrSession session = TreatIntegerAsHandle<XrSession>(current_obj.objectHandle);
            LookUpSessionLabels(session, aug_data->labels);
        }
    }

    // If we found nothing to add, return the original data
    if (!name_found && aug_data->labels.empty()) {
        return;
    }

    // Found additional data - modify an internal copy and return that as the exported data
    memcpy(&aug_data->modified_data, callback_data, sizeof(XrDebugUtilsMessengerCallbackDataEXT));
    aug_data->new_objects.assign(callback_data->objects, callback_data->objects + callback_data->objectCount);

    // Record (overwrite) the names of all incoming objects provided in our internal list
    for (auto& obj : aug_data->new_objects) {
        object_info_.LookUpObjectName(obj);
    }

    // Update local copy & point export to it
    aug_data->modified_data.objects = aug_data->new_objects.data();
    aug_data->modified_data.sessionLabelCount = static_cast<uint32_t>(aug_data->labels.size());
    aug_data->modified_data.sessionLabels = aug_data->labels.empty() ? nullptr : aug_data->labels.data();
    aug_data->exported_data = &aug_data->modified_data;
    return;
}